

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_68f06::IntrusiveListIteratorTest::
TestForward<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
          (IntrusiveListIteratorTest *this,const_iterator first,const_iterator last,
          vector<int,_std::allocator<int>_> *expected)

{
  int line;
  TestObject *pTVar1;
  TestObject *pTVar2;
  char *message;
  AssertionResult gtest_ar;
  internal local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  unsigned_long local_40;
  AssertHelper local_38;
  
  pTVar2 = last.node_;
  pTVar1 = (TestObject *)first.list_;
  local_40 = 0;
  do {
    if (this != (IntrusiveListIteratorTest *)first.node_) {
      __assert_fail("list_ == rhs.list_",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                    ,0x101,
                    "bool wabt::intrusive_list<(anonymous namespace)::TestObject>::const_iterator::operator!=(const_iterator) const [T = (anonymous namespace)::TestObject]"
                   );
    }
    if (pTVar1 == (TestObject *)last.list_) {
      local_48._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ -
            (long)(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ >> 2)
      ;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                (local_58,"count","expected.size()",&local_40,(unsigned_long *)&local_48);
      if (local_58[0] != (internal)0x0) goto LAB_0014b858;
      testing::Message::Message((Message *)&local_48);
      if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (local_50->_M_dataplus)._M_p;
      }
      line = 0xa5;
LAB_0014b82d:
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-intrusive-list.cc"
                 ,line,message);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (local_48._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_48._M_head_impl + 8))();
      }
LAB_0014b858:
      if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_50,local_50);
      }
      return;
    }
    if (pTVar1 == (TestObject *)0x0) {
      __assert_fail("node_",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                    ,0xe0,
                    "pointer wabt::intrusive_list<(anonymous namespace)::TestObject>::const_iterator::operator->() const [T = (anonymous namespace)::TestObject]"
                   );
    }
    testing::internal::CmpHelperEQ<int,int>
              (local_58,"expected[count]","first->data",
               (int *)((long)&(((pTVar2->
                                super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_)
                              ->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_
                      + local_40 * 4),&pTVar1->data);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (local_50->_M_dataplus)._M_p;
      }
      line = 0xa1;
      goto LAB_0014b82d;
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
    local_40 = local_40 + 1;
    pTVar1 = (pTVar1->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
  } while( true );
}

Assistant:

void TestForward(Iter first, Iter last, const std::vector<int>& expected) {
    size_t count = 0;
    while (first != last) {
      ASSERT_EQ(expected[count], first->data);
      ++first;
      ++count;
    }
    ASSERT_EQ(count, expected.size());
  }